

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

uint ot::commissioner::utils::Decode<unsigned_int>(uint8_t *aBuf,size_t aLength)

{
  uint uVar1;
  size_t i;
  long lVar2;
  
  if (3 < aLength) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uint)aBuf[lVar2] | uVar1 << 8;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    return uVar1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned int]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}